

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_api_loader.cpp
# Opt level: O2

bool SetupLuaAPI(void)

{
  lua_gettop = (dll_lua_gettop)LoadAPI("lua_gettop");
  if (((((lua_gettop != (dll_lua_gettop)0x0) &&
        (lua_settop = (dll_lua_settop)LoadAPI("lua_settop"), lua_settop != (dll_lua_settop)0x0)) &&
       (lua_type = (dll_lua_type)LoadAPI("lua_type"), lua_type != (dll_lua_type)0x0)) &&
      (((((lua_typename = (dll_lua_typename)LoadAPI("lua_typename"),
          lua_typename != (dll_lua_typename)0x0 &&
          (lua_tolstring = (dll_lua_tolstring)LoadAPI("lua_tolstring"),
          lua_tolstring != (dll_lua_tolstring)0x0)) &&
         ((lua_toboolean = (dll_lua_toboolean)LoadAPI("lua_toboolean"),
          lua_toboolean != (dll_lua_toboolean)0x0 &&
          ((lua_tothread = (dll_lua_tothread)LoadAPI("lua_tothread"),
           lua_tothread != (dll_lua_tothread)0x0 &&
           (lua_pushnil = (dll_lua_pushnil)LoadAPI("lua_pushnil"),
           lua_pushnil != (dll_lua_pushnil)0x0)))))) &&
        (lua_pushnumber = (dll_lua_pushnumber)LoadAPI("lua_pushnumber"),
        lua_pushnumber != (dll_lua_pushnumber)0x0)) &&
       (((((lua_pushlstring = (dll_lua_pushlstring)LoadAPI("lua_pushlstring"),
           lua_pushlstring != (dll_lua_pushlstring)0x0 &&
           (lua_pushstring = (dll_lua_pushstring)LoadAPI("lua_pushstring"),
           lua_pushstring != (dll_lua_pushstring)0x0)) &&
          (lua_pushcclosure = (dll_lua_pushcclosure)LoadAPI("lua_pushcclosure"),
          lua_pushcclosure != (dll_lua_pushcclosure)0x0)) &&
         ((lua_pushboolean = (dll_lua_pushboolean)LoadAPI("lua_pushboolean"),
          lua_pushboolean != (dll_lua_pushboolean)0x0 &&
          (lua_pushvalue = (dll_lua_pushvalue)LoadAPI("lua_pushvalue"),
          lua_pushvalue != (dll_lua_pushvalue)0x0)))) &&
        ((lua_getfield = (dll_lua_getfield)LoadAPI("lua_getfield"),
         lua_getfield != (dll_lua_getfield)0x0 &&
         ((lua_next = (dll_lua_next)LoadAPI("lua_next"), lua_next != (dll_lua_next)0x0 &&
          (lua_createtable = (dll_lua_createtable)LoadAPI("lua_createtable"),
          lua_createtable != (dll_lua_createtable)0x0)))))))))) &&
     ((((lua_setfield = (dll_lua_setfield)LoadAPI("lua_setfield"),
        lua_setfield != (dll_lua_setfield)0x0 &&
        (((((lua_setmetatable = (dll_lua_setmetatable)LoadAPI("lua_setmetatable"),
            lua_setmetatable != (dll_lua_setmetatable)0x0 &&
            (lua_getstack = (dll_lua_getstack)LoadAPI("lua_getstack"),
            lua_getstack != (dll_lua_getstack)0x0)) &&
           (lua_getinfo = (dll_lua_getinfo)LoadAPI("lua_getinfo"),
           lua_getinfo != (dll_lua_getinfo)0x0)) &&
          ((lua_getlocal = (dll_lua_getlocal)LoadAPI("lua_getlocal"),
           lua_getlocal != (dll_lua_getlocal)0x0 &&
           (lua_getupvalue = (dll_lua_getupvalue)LoadAPI("lua_getupvalue"),
           lua_getupvalue != (dll_lua_getupvalue)0x0)))) &&
         (lua_setupvalue = (dll_lua_setupvalue)LoadAPI("lua_setupvalue"),
         lua_setupvalue != (dll_lua_setupvalue)0x0)))) &&
       (((lua_sethook = (dll_lua_sethook)LoadAPI("lua_sethook"), lua_sethook != (dll_lua_sethook)0x0
         && (luaL_loadstring = (dll_luaL_loadstring)LoadAPI("luaL_loadstring"),
            luaL_loadstring != (dll_luaL_loadstring)0x0)) &&
        ((luaL_checklstring = (dll_luaL_checklstring)LoadAPI("luaL_checklstring"),
         luaL_checklstring != (dll_luaL_checklstring)0x0 &&
         (((luaL_checknumber = (dll_luaL_checknumber)LoadAPI("luaL_checknumber"),
           luaL_checknumber != (dll_luaL_checknumber)0x0 &&
           (lua_topointer = (dll_lua_topointer)LoadAPI("lua_topointer"),
           lua_topointer != (dll_lua_topointer)0x0)) &&
          (lua_getmetatable = (dll_lua_getmetatable)LoadAPI("lua_getmetatable"),
          lua_getmetatable != (dll_lua_getmetatable)0x0)))))))) &&
      ((((lua_rawget = (dll_lua_rawget)LoadAPI("lua_rawget"), lua_rawget != (dll_lua_rawget)0x0 &&
         (lua_rawset = (dll_lua_rawset)LoadAPI("lua_rawset"), lua_rawset != (dll_lua_rawset)0x0)) &&
        (lua_pushlightuserdata = (dll_lua_pushlightuserdata)LoadAPI("lua_pushlightuserdata"),
        lua_pushlightuserdata != (dll_lua_pushlightuserdata)0x0)) &&
       (((lua_touserdata = (dll_lua_touserdata)LoadAPI("lua_touserdata"),
         lua_touserdata != (dll_lua_touserdata)0x0 &&
         (luaL_newstate = (dll_luaL_newstate)LoadAPI("luaL_newstate"),
         luaL_newstate != (dll_luaL_newstate)0x0)) &&
        ((lua_close = (dll_lua_close)LoadAPI("lua_close"), lua_close != (dll_lua_close)0x0 &&
         (((lua_pushthread = (dll_lua_pushthread)LoadAPI("lua_pushthread"),
           lua_pushthread != (dll_lua_pushthread)0x0 &&
           (lua_rawseti = (dll_lua_rawseti)LoadAPI("lua_rawseti"),
           lua_rawseti != (dll_lua_rawseti)0x0)) &&
          (lua_rawgeti = (dll_lua_rawgeti)LoadAPI("lua_rawgeti"),
          lua_rawgeti != (dll_lua_rawgeti)0x0)))))))))))) {
    e_lua_setfenv = (dll_e_lua_setfenv)LoadAPI("lua_setfenv");
    e_lua_tointeger = (dll_e_lua_tointeger)LoadAPI("lua_tointeger");
    e_lua_tonumber = (dll_e_lua_tonumber)LoadAPI("lua_tonumber");
    e_lua_call = (dll_e_lua_call)LoadAPI("lua_call");
    e_lua_pcall = (dll_e_lua_pcall)LoadAPI("lua_pcall");
    e_lua_remove = (dll_e_lua_remove)LoadAPI("lua_remove");
    e_lua_tointegerx = (dll_e_lua_tointegerx)LoadAPI("lua_tointegerx");
    e_lua_tonumberx = (dll_e_lua_tonumberx)LoadAPI("lua_tonumberx");
    e_lua_getglobal = (dll_e_lua_getglobal)LoadAPI("lua_getglobal");
    e_lua_setglobal = (dll_e_lua_setglobal)LoadAPI("lua_setglobal");
    e_lua_callk = (dll_e_lua_callk)LoadAPI("lua_callk");
    e_lua_pcallk = (dll_e_lua_pcallk)LoadAPI("lua_pcallk");
    e_luaL_setfuncs = (dll_e_luaL_setfuncs)LoadAPI("luaL_setfuncs");
    e_lua_absindex = (dll_e_lua_absindex)LoadAPI("lua_absindex");
    e_lua_rawgetp = (dll_e_lua_rawgetp)LoadAPI("lua_rawgetp");
    e_lua_rawsetp = (dll_e_lua_rawsetp)LoadAPI("lua_rawsetp");
    e_lua_newuserdata = (dll_e_lua_newuserdata)LoadAPI("lua_newuserdata");
    e_lua_rotate = (dll_e_lua_rotate)LoadAPI("lua_rotate");
    e_lua_newuserdatauv = (dll_e_lua_newuserdatauv)LoadAPI("lua_newuserdatauv");
    e_luaopen_jit = (dll_e_luaopen_jit)LoadAPI("luaopen_jit");
    LUA_GLOBALSINDEX = 2;
    LUA_REGISTRYINDEX = -0xf4628;
    if (e_lua_newuserdatauv == (dll_e_lua_newuserdatauv)0x0) {
      if (e_lua_rotate == (dll_e_lua_rotate)0x0) {
        if (e_lua_callk == (dll_e_lua_callk)0x0) {
          if (e_luaopen_jit != (dll_e_luaopen_jit)0x0) {
            luaVersion = LUA_JIT;
            LUA_REGISTRYINDEX = -10000;
            LUA_GLOBALSINDEX = -0x2712;
            printf("[EMMY] version: %s, lua version: jit\n","DEV");
            return true;
          }
          LUA_GLOBALSINDEX = -0x2712;
          LUA_REGISTRYINDEX = -10000;
          luaVersion = LUA_51;
        }
        else {
          luaVersion = LUA_52;
        }
      }
      else {
        luaVersion = LUA_53;
      }
    }
    else {
      luaVersion = LUA_54;
    }
    printf("[EMMY] version: %s, lua version: %d\n","DEV");
    return true;
  }
  return false;
}

Assistant:

bool SetupLuaAPI()
{
	LOAD_LUA_API(lua_gettop);
	LOAD_LUA_API(lua_settop);
	LOAD_LUA_API(lua_type);
	LOAD_LUA_API(lua_typename);
	LOAD_LUA_API(lua_tolstring);
	LOAD_LUA_API(lua_toboolean);
	LOAD_LUA_API(lua_tothread);
	LOAD_LUA_API(lua_pushnil);
	LOAD_LUA_API(lua_pushnumber);
	LOAD_LUA_API(lua_pushlstring);
	LOAD_LUA_API(lua_pushstring);
	LOAD_LUA_API(lua_pushcclosure);
	LOAD_LUA_API(lua_pushboolean);
	LOAD_LUA_API(lua_pushvalue);
	LOAD_LUA_API(lua_getfield);
	LOAD_LUA_API(lua_next);
	LOAD_LUA_API(lua_createtable);
	LOAD_LUA_API(lua_setfield);
	LOAD_LUA_API(lua_setmetatable);
	LOAD_LUA_API(lua_getstack);
	LOAD_LUA_API(lua_getinfo);
	LOAD_LUA_API(lua_getlocal);
	LOAD_LUA_API(lua_getupvalue);
	LOAD_LUA_API(lua_setupvalue);
	LOAD_LUA_API(lua_sethook);
	LOAD_LUA_API(luaL_loadstring);
	LOAD_LUA_API(luaL_checklstring);
	LOAD_LUA_API(luaL_checknumber);
	LOAD_LUA_API(lua_topointer);
	LOAD_LUA_API(lua_getmetatable);
	LOAD_LUA_API(lua_rawget);
	LOAD_LUA_API(lua_rawset);
	LOAD_LUA_API(lua_pushlightuserdata);
	LOAD_LUA_API(lua_touserdata);
	LOAD_LUA_API(luaL_newstate);
	LOAD_LUA_API(lua_close);
	LOAD_LUA_API(lua_pushthread);

	LOAD_LUA_API(lua_rawseti);
	LOAD_LUA_API(lua_rawgeti);
	//51
	LOAD_LUA_API_E(lua_setfenv);
	LOAD_LUA_API_E(lua_tointeger);
	LOAD_LUA_API_E(lua_tonumber);
	LOAD_LUA_API_E(lua_call);
	LOAD_LUA_API_E(lua_pcall);
	//51 & 52
	LOAD_LUA_API_E(lua_remove);
	//52 & 53 & 54
	LOAD_LUA_API_E(lua_tointegerx);
	LOAD_LUA_API_E(lua_tonumberx);
	LOAD_LUA_API_E(lua_getglobal);
	LOAD_LUA_API_E(lua_setglobal);
	LOAD_LUA_API_E(lua_callk);
	LOAD_LUA_API_E(lua_pcallk);
	LOAD_LUA_API_E(luaL_setfuncs);
	LOAD_LUA_API_E(lua_absindex);
	LOAD_LUA_API_E(lua_rawgetp);
	LOAD_LUA_API_E(lua_rawsetp);


	// 51 & 52 & 53
	LOAD_LUA_API_E(lua_newuserdata);
	//53
	LOAD_LUA_API_E(lua_rotate);
	//54
	LOAD_LUA_API_E(lua_newuserdatauv);

	//jit
	LOAD_LUA_API_E(luaopen_jit);


	if (e_lua_newuserdatauv)
	{
		luaVersion = LuaVersion::LUA_54;
		LUA_REGISTRYINDEX = -1001000;
		LUA_GLOBALSINDEX = 2;
	}
	else if (e_lua_rotate)
	{
		luaVersion = LuaVersion::LUA_53;
		LUA_REGISTRYINDEX = -1001000;
		LUA_GLOBALSINDEX = 2;
	}
	else if (e_lua_callk)
	{
		luaVersion = LuaVersion::LUA_52;
		//todo
		LUA_REGISTRYINDEX = -1001000;
		LUA_GLOBALSINDEX = 2;
	}
	else if (e_luaopen_jit)
	{
		luaVersion = LuaVersion::LUA_JIT;
		LUA_REGISTRYINDEX = -10000;
		LUA_GLOBALSINDEX = -10002;
	}
	else
	{
		luaVersion = LuaVersion::LUA_51;
		LUA_REGISTRYINDEX = -10000;
		LUA_GLOBALSINDEX = -10002;
	}
	if (luaVersion > LuaVersion::LUA_JIT) {
		printf("[EMMY] version: %s, lua version: %d\n", EMMY_CORE_VERSION, luaVersion);
	}
	else
	{
		printf("[EMMY] version: %s, lua version: jit\n", EMMY_CORE_VERSION);
	}
	return true;
}